

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDCImporter::InternReadFile
          (MDCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  uchar *puVar1;
  BaseVertex *bvert;
  pointer pcVar2;
  uchar *puVar3;
  bool bVar4;
  pointer pbVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  ulong uVar9;
  aiMesh **ppaVar10;
  ulong uVar11;
  aiMesh *paVar12;
  size_t sVar13;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  ulong *puVar14;
  aiFace *paVar15;
  uint *puVar16;
  Logger *this_00;
  aiNode *paVar17;
  aiNode **ppaVar18;
  aiMaterial **ppaVar19;
  aiMaterial *this_01;
  long *plVar20;
  runtime_error *prVar21;
  size_type *psVar22;
  uint uVar23;
  aiFace *paVar24;
  long lVar25;
  uint uVar26;
  MDCImporter *pMVar27;
  Frame *frame;
  uint uVar28;
  Surface *pSVar29;
  Surface *pcSurf;
  char *pcVar30;
  float fVar31;
  float __x;
  float fVar32;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aszShaders;
  aiColor3D clr;
  int iMode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  aiString path;
  char *local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  undefined8 local_4b4;
  undefined4 local_4ac;
  MDCImporter *local_4a8;
  uint *local_4a0;
  ulong local_498;
  uint local_490;
  uint local_48c;
  float local_488;
  undefined4 local_484;
  ulong local_480;
  char *local_478;
  ulong local_470;
  aiFace *local_468;
  char *local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [1032];
  
  pcVar2 = local_438 + 0x10;
  local_438._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"rb","");
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_438._0_8_);
  plVar20 = (long *)CONCAT44(extraout_var,iVar7);
  if ((pointer)local_438._0_8_ != pcVar2) {
    operator_delete((void *)local_438._0_8_);
  }
  if (plVar20 == (long *)0x0) {
    prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_458,"Failed to open MDC file ",pFile);
    plVar20 = (long *)std::__cxx11::string::append((char *)&local_458);
    local_438._0_8_ = *plVar20;
    psVar22 = (size_type *)(plVar20 + 2);
    if ((size_type *)local_438._0_8_ == psVar22) {
      local_438._16_8_ = *psVar22;
      local_438._24_8_ = plVar20[3];
      local_438._0_8_ = local_438 + 0x10;
    }
    else {
      local_438._16_8_ = *psVar22;
    }
    local_438._8_8_ = plVar20[1];
    *plVar20 = (long)psVar22;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    std::runtime_error::runtime_error(prVar21,(string *)local_438);
    *(undefined ***)prVar21 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar8 = (**(code **)(*plVar20 + 0x30))(plVar20);
  this->fileSize = uVar8;
  if ((uVar8 & 0xfffffff0) < 0x70) {
    prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"MDC File is too small.","")
    ;
    std::runtime_error::runtime_error(prVar21,(string *)local_438);
    *(undefined ***)prVar21 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_458,(ulong)uVar8,
             (allocator_type *)local_438);
  (**(code **)(*plVar20 + 0x10))(plVar20,local_458._M_dataplus._M_p,1,this->fileSize);
  this->mBuffer = (uchar *)local_458._M_dataplus._M_p;
  this->pcHeader = (Header *)local_458._M_dataplus._M_p;
  ValidateHeader(this);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = this->mBuffer;
  uVar8 = this->pcHeader->ulOffsetBorderFrames;
  uVar11 = (ulong)this->pcHeader->ulOffsetSurfaces;
  uVar28 = this->configFrameID;
  pSVar29 = (Surface *)(puVar3 + uVar11);
  puVar1 = puVar3 + uVar11;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1 = puVar3 + uVar11 + 0x43;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar3 + uVar11 + 0x53;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar3 + uVar11 + 99;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar3 + uVar11 + 0x6c;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  uVar11 = 0;
  local_4a8 = this;
  if (this->pcHeader->ulNumSurfaces != 0) {
    uVar26 = 0;
    pcSurf = pSVar29;
    do {
      ValidateSurfaceHeader(local_4a8,pcSurf);
      if ((pcSurf->ulNumVertices != 0) && (pcSurf->ulNumTriangles != 0)) {
        pScene->mNumMeshes = pScene->mNumMeshes + 1;
      }
      uVar23 = (int)uVar11 + pcSurf->ulNumShaders;
      uVar11 = (ulong)uVar23;
      uVar9 = (ulong)pcSurf->ulOffsetEnd;
      pcVar30 = pcSurf->ucName + (uVar9 - 4);
      pcVar30[0] = '\0';
      pcVar30[1] = '\0';
      pcVar30[2] = '\0';
      pcVar30[3] = '\0';
      pcVar30 = pcSurf->ucName + uVar9 + 0x3f;
      pcVar30[0] = '\0';
      pcVar30[1] = '\0';
      pcVar30[2] = '\0';
      pcVar30[3] = '\0';
      pcVar30[4] = '\0';
      pcVar30[5] = '\0';
      pcVar30[6] = '\0';
      pcVar30[7] = '\0';
      pcVar30[8] = '\0';
      pcVar30[9] = '\0';
      pcVar30[10] = '\0';
      pcVar30[0xb] = '\0';
      pcVar30[0xc] = '\0';
      pcVar30[0xd] = '\0';
      pcVar30[0xe] = '\0';
      pcVar30[0xf] = '\0';
      pcVar30 = pcSurf->ucName + uVar9 + 0x4f;
      pcVar30[0] = '\0';
      pcVar30[1] = '\0';
      pcVar30[2] = '\0';
      pcVar30[3] = '\0';
      pcVar30[4] = '\0';
      pcVar30[5] = '\0';
      pcVar30[6] = '\0';
      pcVar30[7] = '\0';
      pcVar30[8] = '\0';
      pcVar30[9] = '\0';
      pcVar30[10] = '\0';
      pcVar30[0xb] = '\0';
      pcVar30[0xc] = '\0';
      pcVar30[0xd] = '\0';
      pcVar30[0xe] = '\0';
      pcVar30[0xf] = '\0';
      pcVar30 = pcSurf->ucName + uVar9 + 0x5f;
      pcVar30[0] = '\0';
      pcVar30[1] = '\0';
      pcVar30[2] = '\0';
      pcVar30[3] = '\0';
      pcVar30[4] = '\0';
      pcVar30[5] = '\0';
      pcVar30[6] = '\0';
      pcVar30[7] = '\0';
      pcVar30[8] = '\0';
      pcVar30[9] = '\0';
      pcVar30[10] = '\0';
      pcVar30[0xb] = '\0';
      pcVar30[0xc] = '\0';
      pcVar30[0xd] = '\0';
      pcVar30[0xe] = '\0';
      pcVar30[0xf] = '\0';
      pcVar30 = pcSurf->ucName + uVar9 + 0x68;
      pcVar30[0] = '\0';
      pcVar30[1] = '\0';
      pcVar30[2] = '\0';
      pcVar30[3] = '\0';
      pcVar30[4] = '\0';
      pcVar30[5] = '\0';
      pcVar30[6] = '\0';
      pcVar30[7] = '\0';
      pcVar30[8] = '\0';
      pcVar30[9] = '\0';
      pcVar30[10] = '\0';
      pcVar30[0xb] = '\0';
      pcVar30[0xc] = '\0';
      pcVar30[0xd] = '\0';
      pcVar30[0xe] = '\0';
      pcVar30[0xf] = '\0';
      pcSurf = (Surface *)(pcSurf->ucName + (uVar9 - 4));
      uVar26 = uVar26 + 1;
    } while (uVar26 < local_4a8->pcHeader->ulNumSurfaces);
    uVar11 = (ulong)uVar23;
  }
  pMVar27 = local_4a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_4d8,uVar11);
  ppaVar10 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
  pScene->mMeshes = ppaVar10;
  if (pScene->mNumMeshes != 0) {
    uVar11 = 0;
    do {
      pScene->mMeshes[uVar11] = (aiMesh *)0x0;
      uVar11 = uVar11 + 1;
    } while (uVar11 < pScene->mNumMeshes);
  }
  if (pMVar27->pcHeader->ulNumSurfaces != 0) {
    frame = (Frame *)(puVar3 + (ulong)uVar8 + (ulong)uVar28 * 0x38);
    local_480 = 0xffffffff;
    uVar28 = 0;
    uVar8 = 0;
    do {
      if ((pSVar29->ulNumVertices != 0) && (pSVar29->ulNumTriangles != 0)) {
        local_48c = uVar8;
        paVar12 = (aiMesh *)operator_new(0x520);
        paVar12->mPrimitiveTypes = 0;
        paVar12->mNumVertices = 0;
        paVar12->mNumFaces = 0;
        memset(&paVar12->mVertices,0,0xcc);
        paVar12->mBones = (aiBone **)0x0;
        paVar12->mMaterialIndex = 0;
        (paVar12->mName).length = 0;
        (paVar12->mName).data[0] = '\0';
        memset((paVar12->mName).data + 1,0x1b,0x3ff);
        paVar12->mNumAnimMeshes = 0;
        paVar12->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar12->mMethod = 0;
        (paVar12->mAABB).mMin.x = 0.0;
        (paVar12->mAABB).mMin.y = 0.0;
        (paVar12->mAABB).mMin.z = 0.0;
        (paVar12->mAABB).mMax.x = 0.0;
        (paVar12->mAABB).mMax.y = 0.0;
        (paVar12->mAABB).mMax.z = 0.0;
        paVar12->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar12->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar12->mNumUVComponents[0] = 0;
        paVar12->mNumUVComponents[1] = 0;
        paVar12->mNumUVComponents[2] = 0;
        paVar12->mNumUVComponents[3] = 0;
        paVar12->mNumUVComponents[4] = 0;
        paVar12->mNumUVComponents[5] = 0;
        paVar12->mNumUVComponents[6] = 0;
        paVar12->mNumUVComponents[7] = 0;
        paVar12->mColors[0] = (aiColor4D *)0x0;
        paVar12->mColors[1] = (aiColor4D *)0x0;
        paVar12->mColors[2] = (aiColor4D *)0x0;
        paVar12->mColors[3] = (aiColor4D *)0x0;
        paVar12->mColors[4] = (aiColor4D *)0x0;
        paVar12->mColors[5] = (aiColor4D *)0x0;
        paVar12->mColors[6] = (aiColor4D *)0x0;
        paVar12->mColors[7] = (aiColor4D *)0x0;
        pScene->mMeshes[uVar28] = paVar12;
        uVar8 = pSVar29->ulNumTriangles;
        paVar12->mNumFaces = uVar8;
        paVar12->mNumVertices = uVar8 * 3;
        local_490 = uVar28;
        sVar13 = strnlen(pSVar29->ucName,0x3f);
        pcVar2 = local_438 + 0x10;
        local_438._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,pSVar29->ucName,pSVar29->ucName + sVar13);
        uVar6 = local_438._8_8_;
        if ((ulong)local_438._8_8_ < 0x400) {
          (paVar12->mName).length = (ai_uint32)local_438._8_8_;
          memcpy((paVar12->mName).data,(void *)local_438._0_8_,local_438._8_8_);
          (paVar12->mName).data[uVar6] = '\0';
        }
        if ((pointer)local_438._0_8_ != pcVar2) {
          operator_delete((void *)local_438._0_8_);
        }
        if (pSVar29->ulNumShaders == 0) {
          if ((uint)local_480 == 0xffffffff) {
            local_480 = (ulong)((long)local_4d8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4d8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5;
            paVar12->mMaterialIndex = (uint)local_480;
            local_438._8_8_ = 0;
            local_438._16_8_ = local_438._16_8_ & 0xffffffffffffff00;
            local_438._0_8_ = pcVar2;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_4d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_438);
            goto LAB_0045d57c;
          }
          paVar12->mMaterialIndex = (uint)local_480;
        }
        else {
          pcVar30 = pSVar29->ucName + ((ulong)pSVar29->ulOffsetShaders - 4);
          paVar12->mMaterialIndex =
               (uint)((ulong)((long)local_4d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_4d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
          sVar13 = strnlen(pcVar30,0x40);
          local_438._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,pcVar30,pcVar30 + sVar13);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4d8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438
                    );
LAB_0045d57c:
          if ((pointer)local_438._0_8_ != pcVar2) {
            operator_delete((void *)local_438._0_8_);
          }
        }
        uVar8 = paVar12->mNumVertices;
        uVar11 = (ulong)uVar8;
        __s = (aiVector3D *)operator_new__(uVar11 * 0xc);
        if (uVar11 != 0) {
          memset(__s,0,((uVar11 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar12->mVertices = __s;
        __s_00 = (aiVector3D *)operator_new__(uVar11 * 0xc);
        if (uVar8 != 0) {
          memset(__s_00,0,((uVar11 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar12->mNormals = __s_00;
        uVar11 = (ulong)paVar12->mNumVertices;
        __s_01 = (aiVector3D *)operator_new__(uVar11 * 0xc);
        if (uVar11 != 0) {
          memset(__s_01,0,((uVar11 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar12->mTextureCoords[0] = __s_01;
        uVar11 = (ulong)paVar12->mNumFaces;
        puVar14 = (ulong *)operator_new__(uVar11 * 0x10 + 8);
        *puVar14 = uVar11;
        paVar24 = (aiFace *)(puVar14 + 1);
        if (uVar11 != 0) {
          paVar15 = paVar24;
          do {
            paVar15->mNumIndices = 0;
            paVar15->mIndices = (uint *)0x0;
            paVar15 = paVar15 + 1;
          } while (paVar15 != paVar24 + uVar11);
        }
        paVar12->mFaces = paVar24;
        local_4a0 = (uint *)(ulong)pSVar29->ulOffsetTriangles;
        local_478 = (char *)(ulong)pSVar29->ulOffsetTexCoords;
        uVar11 = (ulong)local_4a8->configFrameID;
        bVar4 = true;
        if (((uVar11 == 0) || (pSVar29->ulNumCompFrames == 0)) ||
           (*(short *)(pSVar29->ucName + uVar11 * 2 + (ulong)pSVar29->ulOffsetFrameCompFrames + -4)
            < 0)) {
          local_4f0 = (char *)0x0;
        }
        else {
          local_4f0 = pSVar29->ucName +
                      (ulong)((int)*(short *)(pSVar29->ucName +
                                             uVar11 * 2 + (ulong)pSVar29->ulOffsetFrameCompFrames +
                                             -4) * pSVar29->ulNumVertices) * 4 +
                      (ulong)pSVar29->ulOffsetCompVerts + -4;
          bVar4 = false;
        }
        if (pSVar29->ulNumTriangles != 0) {
          local_4a0 = (uint *)((long)local_4a0 + (long)pSVar29);
          local_478 = pSVar29->ucName + (long)(local_478 + -4);
          local_460 = pSVar29->ucName +
                      (ulong)((int)*(short *)(pSVar29->ucName +
                                             uVar11 * 2 + (ulong)pSVar29->ulOffsetFrameBaseFrames +
                                             -4) * pSVar29->ulNumVertices * 4) * 8 +
                      (ulong)pSVar29->ulOffsetBaseVerts + -4;
          local_498 = 0;
          do {
            paVar24->mNumIndices = 3;
            puVar16 = (uint *)operator_new__(0xc);
            local_470 = (ulong)(uint)((int)local_498 * 3);
            paVar24->mIndices = puVar16;
            lVar25 = 0;
            puVar16 = local_4a0;
            local_468 = paVar24;
            do {
              uVar8 = *puVar16;
              if (pSVar29->ulNumVertices <= uVar8) {
                this_00 = DefaultLogger::get();
                Logger::error(this_00,"MDC vertex index is out of range");
                uVar8 = pSVar29->ulNumVertices - 1;
              }
              uVar11 = (ulong)uVar8;
              bvert = (BaseVertex *)(local_460 + uVar11 * 8);
              if (bVar4) {
                *(float *)((long)&__s->x + lVar25) = (float)(int)bvert->x * 0.015625;
                *(float *)((long)&__s->y + lVar25) = (float)(int)bvert->y * 0.015625;
                *(float *)((long)&__s->z + lVar25) = (float)(int)bvert->z * 0.015625;
                fVar32 = (float)(bvert->normal >> 8) * 0.024546297;
                __x = (float)(byte)bvert->normal * 0.024546297;
                local_488 = cosf(fVar32);
                fVar31 = sinf(__x);
                *(float *)((long)&__s_00->x + lVar25) = fVar31 * local_488;
                fVar31 = sinf(fVar32);
                fVar32 = sinf(__x);
                *(float *)((long)&__s_00->y + lVar25) = fVar32 * fVar31;
                fVar31 = cosf(__x);
                *(float *)((long)&__s_00->z + lVar25) = fVar31;
                *(undefined4 *)((long)&__s_01->x + lVar25) = *(undefined4 *)(local_478 + uVar11 * 8)
                ;
                *(float *)((long)&__s_01->y + lVar25) = 1.0 - *(float *)(local_478 + uVar11 * 8 + 4)
                ;
              }
              else {
                MDC::BuildVertex(frame,bvert,(CompressedVertex *)(local_4f0 + uVar11 * 4),
                                 (aiVector3D *)((long)&__s->x + lVar25),
                                 (aiVector3D *)((long)&__s_00->x + lVar25));
              }
              *(float *)((long)&__s->x + lVar25) =
                   (frame->localOrigin).x + *(float *)((long)&__s->x + lVar25);
              *(float *)((long)&__s->y + lVar25) =
                   (frame->localOrigin).y + *(float *)((long)&__s->y + lVar25);
              *(float *)((long)&__s->z + lVar25) =
                   (frame->localOrigin).z + *(float *)((long)&__s->z + lVar25);
              puVar16 = puVar16 + 1;
              lVar25 = lVar25 + 0xc;
            } while (lVar25 != 0x24);
            uVar8 = (uint)local_470;
            *local_468->mIndices = uVar8 + 2;
            local_468->mIndices[1] = uVar8 + 1;
            local_468->mIndices[2] = uVar8;
            uVar8 = (int)local_498 + 1;
            local_498 = (ulong)uVar8;
            local_4a0 = local_4a0 + 3;
            paVar24 = local_468 + 1;
            __s_01 = __s_01 + 3;
            __s_00 = __s_00 + 3;
            __s = __s + 3;
          } while (uVar8 < pSVar29->ulNumTriangles);
        }
        uVar28 = local_490 + 1;
        uVar11 = (ulong)pSVar29->ulOffsetEnd;
        pcVar30 = pSVar29->ucName + (uVar11 - 4);
        pcVar30[0] = '\0';
        pcVar30[1] = '\0';
        pcVar30[2] = '\0';
        pcVar30[3] = '\0';
        pcVar30 = pSVar29->ucName + uVar11 + 0x3f;
        pcVar30[0] = '\0';
        pcVar30[1] = '\0';
        pcVar30[2] = '\0';
        pcVar30[3] = '\0';
        pcVar30[4] = '\0';
        pcVar30[5] = '\0';
        pcVar30[6] = '\0';
        pcVar30[7] = '\0';
        pcVar30[8] = '\0';
        pcVar30[9] = '\0';
        pcVar30[10] = '\0';
        pcVar30[0xb] = '\0';
        pcVar30[0xc] = '\0';
        pcVar30[0xd] = '\0';
        pcVar30[0xe] = '\0';
        pcVar30[0xf] = '\0';
        pcVar30 = pSVar29->ucName + uVar11 + 0x4f;
        pcVar30[0] = '\0';
        pcVar30[1] = '\0';
        pcVar30[2] = '\0';
        pcVar30[3] = '\0';
        pcVar30[4] = '\0';
        pcVar30[5] = '\0';
        pcVar30[6] = '\0';
        pcVar30[7] = '\0';
        pcVar30[8] = '\0';
        pcVar30[9] = '\0';
        pcVar30[10] = '\0';
        pcVar30[0xb] = '\0';
        pcVar30[0xc] = '\0';
        pcVar30[0xd] = '\0';
        pcVar30[0xe] = '\0';
        pcVar30[0xf] = '\0';
        pcVar30 = pSVar29->ucName + uVar11 + 0x5f;
        pcVar30[0] = '\0';
        pcVar30[1] = '\0';
        pcVar30[2] = '\0';
        pcVar30[3] = '\0';
        pcVar30[4] = '\0';
        pcVar30[5] = '\0';
        pcVar30[6] = '\0';
        pcVar30[7] = '\0';
        pcVar30[8] = '\0';
        pcVar30[9] = '\0';
        pcVar30[10] = '\0';
        pcVar30[0xb] = '\0';
        pcVar30[0xc] = '\0';
        pcVar30[0xd] = '\0';
        pcVar30[0xe] = '\0';
        pcVar30[0xf] = '\0';
        pcVar30 = pSVar29->ucName + uVar11 + 0x68;
        pcVar30[0] = '\0';
        pcVar30[1] = '\0';
        pcVar30[2] = '\0';
        pcVar30[3] = '\0';
        pcVar30[4] = '\0';
        pcVar30[5] = '\0';
        pcVar30[6] = '\0';
        pcVar30[7] = '\0';
        pcVar30[8] = '\0';
        pcVar30[9] = '\0';
        pcVar30[10] = '\0';
        pcVar30[0xb] = '\0';
        pcVar30[0xc] = '\0';
        pcVar30[0xd] = '\0';
        pcVar30[0xe] = '\0';
        pcVar30[0xf] = '\0';
        pSVar29 = (Surface *)(pSVar29->ucName + (uVar11 - 4));
        pMVar27 = local_4a8;
        uVar8 = local_48c;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < pMVar27->pcHeader->ulNumSurfaces);
  }
  if (pScene->mNumMeshes == 1) {
    paVar17 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar17);
    pScene->mRootNode = paVar17;
    paVar12 = *pScene->mMeshes;
    if (paVar12 != (aiMesh *)0x0) {
      if (paVar17 != (aiNode *)&paVar12->mName) {
        uVar8 = (paVar12->mName).length;
        (paVar17->mName).length = uVar8;
        memcpy((paVar17->mName).data,(paVar12->mName).data,(ulong)uVar8);
        (paVar17->mName).data[uVar8] = '\0';
      }
      paVar17->mNumMeshes = 1;
      puVar16 = (uint *)operator_new__(4);
      paVar17->mMeshes = puVar16;
      *puVar16 = 0;
    }
  }
  else {
    if (pScene->mNumMeshes == 0) {
      prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_438._0_8_ = local_438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Invalid MDC file: File contains no valid mesh","");
      std::runtime_error::runtime_error(prVar21,(string *)local_438);
      *(undefined ***)prVar21 = &PTR__runtime_error_0081d260;
      __cxa_throw(prVar21,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar17 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar17);
    pScene->mRootNode = paVar17;
    uVar8 = pScene->mNumMeshes;
    paVar17->mNumChildren = uVar8;
    ppaVar18 = (aiNode **)operator_new__((ulong)uVar8 << 3);
    paVar17->mChildren = ppaVar18;
    (paVar17->mName).length = 6;
    builtin_strncpy((paVar17->mName).data,"<root>",7);
    if (pScene->mNumMeshes != 0) {
      uVar11 = 0;
      do {
        paVar17 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar17);
        pScene->mRootNode->mChildren[uVar11] = paVar17;
        paVar17->mParent = pScene->mRootNode;
        paVar12 = pScene->mMeshes[uVar11];
        if (paVar17 != (aiNode *)&paVar12->mName) {
          uVar8 = (paVar12->mName).length;
          (paVar17->mName).length = uVar8;
          memcpy((paVar17->mName).data,(paVar12->mName).data,(ulong)uVar8);
          (paVar17->mName).data[uVar8] = '\0';
        }
        paVar17->mNumMeshes = 1;
        puVar16 = (uint *)operator_new__(4);
        paVar17->mMeshes = puVar16;
        *puVar16 = (uint)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar11 < pScene->mNumMeshes);
    }
  }
  pScene->mNumMaterials =
       (uint)((ulong)((long)local_4d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_4d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  ppaVar19 = (aiMaterial **)
             operator_new__((ulong)((long)local_4d8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_4d8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                            0x7fffffff8);
  pScene->mMaterials = ppaVar19;
  if (pScene->mNumMaterials != 0) {
    lVar25 = 8;
    uVar11 = 0;
    do {
      this_01 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_01);
      pbVar5 = local_4d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pScene->mMaterials[uVar11] = this_01;
      local_484 = 2;
      aiMaterial::AddBinaryProperty(this_01,&local_484,4,"$mat.shadingm",0,0,aiPTI_Integer);
      local_4b4 = 0x3d4ccccd3d4ccccd;
      local_4ac = 0x3d4ccccd;
      aiMaterial::AddBinaryProperty(this_01,&local_4b4,0xc,"$clr.ambient",0,0,aiPTI_Float);
      local_4ac = *(undefined4 *)
                   (&DAT_006da5b8 +
                   (ulong)(*(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar25) == 0) * 4);
      local_4b4 = CONCAT44(local_4ac,local_4ac);
      aiMaterial::AddBinaryProperty(this_01,&local_4b4,0xc,"$clr.diffuse",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty(this_01,&local_4b4,0xc,"$clr.specular",0,0,aiPTI_Float);
      if (*(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar25) != 0) {
        local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
        memset(local_438 + 5,0x1b,0x3ff);
        uVar9 = *(ulong *)((long)&(pbVar5->_M_dataplus)._M_p + lVar25);
        if (uVar9 < 0x400) {
          local_438._0_4_ = (int)uVar9;
          memcpy(local_438 + 4,*(void **)((long)pbVar5 + lVar25 + -8),uVar9);
          local_438[uVar9 + 4] = 0;
        }
        aiMaterial::AddProperty(this_01,(aiString *)local_438,"$tex.file",1,0);
      }
      uVar11 = uVar11 + 1;
      lVar25 = lVar25 + 0x20;
    } while (uVar11 < pScene->mNumMaterials);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  if ((Header *)local_458._M_dataplus._M_p != (Header *)0x0) {
    operator_delete(local_458._M_dataplus._M_p);
  }
  (**(code **)(*plVar20 + 8))();
  return;
}

Assistant:

void MDCImporter::InternReadFile(
    const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MDC file " + pFile + ".");

    // check whether the mdc file is large enough to contain the file header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MDC::Header))
        throw DeadlyImportError( "MDC File is too small.");

    std::vector<unsigned char> mBuffer2(fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    // validate the file header
    this->pcHeader = (BE_NCONST MDC::Header*)this->mBuffer;
    this->ValidateHeader();

    std::vector<std::string> aszShaders;

    // get a pointer to the frame we want to read
    BE_NCONST MDC::Frame* pcFrame = (BE_NCONST MDC::Frame*)(this->mBuffer+
        this->pcHeader->ulOffsetBorderFrames);

    // no need to swap the other members, we won't need them
    pcFrame += configFrameID;
    AI_SWAP4( pcFrame->localOrigin[0] );
    AI_SWAP4( pcFrame->localOrigin[1] );
    AI_SWAP4( pcFrame->localOrigin[2] );

    // get the number of valid surfaces
    BE_NCONST MDC::Surface* pcSurface, *pcSurface2;
    pcSurface = pcSurface2 = new (mBuffer + pcHeader->ulOffsetSurfaces) MDC::Surface;
    unsigned int iNumShaders = 0;
    for (unsigned int i = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        // validate the surface header
        this->ValidateSurfaceHeader(pcSurface2);

        if (pcSurface2->ulNumVertices && pcSurface2->ulNumTriangles)++pScene->mNumMeshes;
        iNumShaders += pcSurface2->ulNumShaders;
        pcSurface2 = new ((int8_t*)pcSurface2 + pcSurface2->ulOffsetEnd) MDC::Surface;
    }
    aszShaders.reserve(iNumShaders);
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    // necessary that we don't crash if an exception occurs
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mMeshes[i] = NULL;

    // now read all surfaces
    unsigned int iDefaultMatIndex = UINT_MAX;
    for (unsigned int i = 0, iNum = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        if (!pcSurface->ulNumVertices || !pcSurface->ulNumTriangles)continue;
        aiMesh* pcMesh = pScene->mMeshes[iNum++] = new aiMesh();

        pcMesh->mNumFaces = pcSurface->ulNumTriangles;
        pcMesh->mNumVertices = pcMesh->mNumFaces * 3;

        // store the name of the surface for use as node name.
        pcMesh->mName.Set(std::string(pcSurface->ucName
                                    , strnlen(pcSurface->ucName, AI_MDC_MAXQPATH - 1)));

        // go to the first shader in the file. ignore the others.
        if (pcSurface->ulNumShaders)
        {
            const MDC::Shader* pcShader = (const MDC::Shader*)((int8_t*)pcSurface + pcSurface->ulOffsetShaders);
            pcMesh->mMaterialIndex = (unsigned int)aszShaders.size();

            // create a new shader
            aszShaders.push_back(std::string( pcShader->ucName, 
                ::strnlen(pcShader->ucName, sizeof(pcShader->ucName)) ));
        }
        // need to create a default material
        else if (UINT_MAX == iDefaultMatIndex)
        {
            pcMesh->mMaterialIndex = iDefaultMatIndex = (unsigned int)aszShaders.size();
            aszShaders.push_back(std::string());
        }
        // otherwise assign a reference to the default material
        else pcMesh->mMaterialIndex = iDefaultMatIndex;

        // allocate output storage for the mesh
        aiVector3D* pcVertCur   = pcMesh->mVertices         = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcNorCur    = pcMesh->mNormals          = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcUVCur     = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        aiFace* pcFaceCur       = pcMesh->mFaces            = new aiFace[pcMesh->mNumFaces];

        // create all vertices/faces
        BE_NCONST MDC::Triangle* pcTriangle = (BE_NCONST MDC::Triangle*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTriangles);

        BE_NCONST MDC::TexturCoord* const pcUVs = (BE_NCONST MDC::TexturCoord*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTexCoords);

        // get a pointer to the uncompressed vertices
        int16_t iOfs = *((int16_t*) ((int8_t*) pcSurface +
            pcSurface->ulOffsetFrameBaseFrames) +  this->configFrameID);

        AI_SWAP2(iOfs);

        BE_NCONST MDC::BaseVertex* const pcVerts = (BE_NCONST MDC::BaseVertex*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetBaseVerts) +
            ((int)iOfs * pcSurface->ulNumVertices * 4);

        // do the main swapping stuff ...
#if (defined AI_BUILD_BIG_ENDIAN)

        // swap all triangles
        for (unsigned int i = 0; i < pcSurface->ulNumTriangles;++i)
        {
            AI_SWAP4( pcTriangle[i].aiIndices[0] );
            AI_SWAP4( pcTriangle[i].aiIndices[1] );
            AI_SWAP4( pcTriangle[i].aiIndices[2] );
        }

        // swap all vertices
        for (unsigned int i = 0; i < pcSurface->ulNumVertices*pcSurface->ulNumBaseFrames;++i)
        {
            AI_SWAP2( pcVerts->normal );
            AI_SWAP2( pcVerts->x );
            AI_SWAP2( pcVerts->y );
            AI_SWAP2( pcVerts->z );
        }

        // swap all texture coordinates
        for (unsigned int i = 0; i < pcSurface->ulNumVertices;++i)
        {
            AI_SWAP4( pcUVs->v );
            AI_SWAP4( pcUVs->v );
        }

#endif

        const MDC::CompressedVertex* pcCVerts = NULL;
        int16_t* mdcCompVert = NULL;

        // access compressed frames for large frame numbers, but never for the first
        if( this->configFrameID && pcSurface->ulNumCompFrames > 0 )
        {
            mdcCompVert = (int16_t*) ((int8_t*)pcSurface+pcSurface->ulOffsetFrameCompFrames) + this->configFrameID;
            AI_SWAP2P(mdcCompVert);
            if( *mdcCompVert >= 0 )
            {
                pcCVerts = (const MDC::CompressedVertex*)((int8_t*)pcSurface +
                    pcSurface->ulOffsetCompVerts) + *mdcCompVert * pcSurface->ulNumVertices;
            }
            else mdcCompVert = NULL;
        }

        // copy all faces
        for (unsigned int iFace = 0; iFace < pcSurface->ulNumTriangles;++iFace,
            ++pcTriangle,++pcFaceCur)
        {
            const unsigned int iOutIndex = iFace*3;
            pcFaceCur->mNumIndices = 3;
            pcFaceCur->mIndices = new unsigned int[3];

            for (unsigned int iIndex = 0; iIndex < 3;++iIndex,
                ++pcVertCur,++pcUVCur,++pcNorCur)
            {
                uint32_t quak = pcTriangle->aiIndices[iIndex];
                if (quak >= pcSurface->ulNumVertices)
                {
                    ASSIMP_LOG_ERROR("MDC vertex index is out of range");
                    quak = pcSurface->ulNumVertices-1;
                }

                // compressed vertices?
                if (mdcCompVert)
                {
                    MDC::BuildVertex(*pcFrame,pcVerts[quak],pcCVerts[quak],
                        *pcVertCur,*pcNorCur);
                }
                else
                {
                    // copy position
                    pcVertCur->x = pcVerts[quak].x * AI_MDC_BASE_SCALING;
                    pcVertCur->y = pcVerts[quak].y * AI_MDC_BASE_SCALING;
                    pcVertCur->z = pcVerts[quak].z * AI_MDC_BASE_SCALING;

                    // copy normals
                    MD3::LatLngNormalToVec3( pcVerts[quak].normal, &pcNorCur->x );

                    // copy texture coordinates
                    pcUVCur->x = pcUVs[quak].u;
                    pcUVCur->y = ai_real( 1.0 )-pcUVs[quak].v; // DX to OGL
                }
                pcVertCur->x += pcFrame->localOrigin[0] ;
                pcVertCur->y += pcFrame->localOrigin[1] ;
                pcVertCur->z += pcFrame->localOrigin[2] ;
            }

            // swap the face order - DX to OGL
            pcFaceCur->mIndices[0] = iOutIndex + 2;
            pcFaceCur->mIndices[1] = iOutIndex + 1;
            pcFaceCur->mIndices[2] = iOutIndex + 0;
        }

        pcSurface =  new ((int8_t*)pcSurface + pcSurface->ulOffsetEnd) MDC::Surface;
    }

    // create a flat node graph with a root node and one child for each surface
    if (!pScene->mNumMeshes)
        throw DeadlyImportError( "Invalid MDC file: File contains no valid mesh");
    else if (1 == pScene->mNumMeshes)
    {
        pScene->mRootNode = new aiNode();
        if ( nullptr != pScene->mMeshes[0] ) {
            pScene->mRootNode->mName = pScene->mMeshes[0]->mName;
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
    }
    else
    {
        pScene->mRootNode = new aiNode();
        pScene->mRootNode->mNumChildren = pScene->mNumMeshes;
        pScene->mRootNode->mChildren = new aiNode*[pScene->mNumMeshes];
        pScene->mRootNode->mName.Set("<root>");
        for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        {
            aiNode* pcNode = pScene->mRootNode->mChildren[i] = new aiNode();
            pcNode->mParent = pScene->mRootNode;
            pcNode->mName = pScene->mMeshes[i]->mName;
            pcNode->mNumMeshes = 1;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
        }
    }

    // create materials
    pScene->mNumMaterials = (unsigned int)aszShaders.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[i] = pcMat;

        const std::string& name = aszShaders[i];

        int iMode = (int)aiShadingMode_Gouraud;
        pcMat->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // add a small ambient color value - RtCW seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        if (name.length())clr.b = clr.g = clr.r = 1.0f;
        else clr.b = clr.g = clr.r = 0.6f;

        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        if (name.length())
        {
            aiString path;
            path.Set(name);
            pcMat->AddProperty(&path,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }
}